

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O0

int get_maxparts(int chipset)

{
  int local_c;
  int chipset_local;
  
  switch(chipset) {
  case 0x10:
  case 0x11:
  case 0x15:
  case 0x17:
  case 0x18:
  case 0x20:
  case 0x25:
  case 0x28:
  case 0x30:
  case 0x35:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x47:
  case 0x49:
    local_c = 4;
    break;
  default:
    abort();
  case 0x1a:
  case 0x1f:
  case 0x2a:
  case 0x4c:
  case 0x4e:
  case 99:
  case 0x67:
  case 0x68:
    local_c = 0;
    break;
  case 0x31:
  case 0x36:
  case 0x43:
  case 0x4b:
    local_c = 2;
    break;
  case 0x44:
  case 0x46:
  case 0x4a:
    local_c = 1;
  }
  return local_c;
}

Assistant:

int get_maxparts(int chipset) {
	switch (chipset) {
		case 0x1a:
		case 0x1f:
		case 0x2a:
		case 0x4e:
		case 0x4c:
		case 0x67:
		case 0x68:
		case 0x63:
			return 0;
		case 0x10:
		case 0x15:
		case 0x11:
		case 0x17:
		case 0x18:
		case 0x20:
		case 0x25:
		case 0x28:
		case 0x30:
		case 0x35:
		case 0x40:
		case 0x41:
		case 0x42:
		case 0x47:
		case 0x49:
			return 4;
		case 0x31:
		case 0x36:
		case 0x43:
		case 0x4b:
			return 2;
		case 0x44:
		case 0x4a:
		case 0x46:
			return 1;
		default:
			abort();
	}
}